

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::scanTokens(yaml *this,StringRef Input)

{
  StringRef Input_00;
  int local_20c;
  undefined1 local_208 [8];
  Token T;
  undefined1 local_1c0 [8];
  Scanner scanner;
  SourceMgr SM;
  StringRef Input_local;
  
  SourceMgr::SourceMgr((SourceMgr *)&scanner.EC);
  Input_00.Length = (size_t)Input.Data;
  Input_00.Data = (char *)this;
  T.Value.field_2._8_8_ = this;
  Scanner::Scanner((Scanner *)local_1c0,Input_00,(SourceMgr *)&scanner.EC,true,(error_code *)0x0);
  do {
    Scanner::getNext((Token *)local_208,(Scanner *)local_1c0);
    if (local_208._0_4_ == TK_StreamEnd) {
      local_20c = 3;
    }
    else if (local_208._0_4_ == TK_Error) {
      Input_local.Length._7_1_ = 0;
      local_20c = 1;
    }
    else {
      local_20c = 0;
    }
    Token::~Token((Token *)local_208);
  } while (local_20c == 0);
  if (local_20c == 3) {
    Input_local.Length._7_1_ = 1;
  }
  Scanner::~Scanner((Scanner *)local_1c0);
  SourceMgr::~SourceMgr((SourceMgr *)&scanner.EC);
  return (bool)(Input_local.Length._7_1_ & 1);
}

Assistant:

bool yaml::scanTokens(StringRef Input) {
  SourceMgr SM;
  Scanner scanner(Input, SM);
  while (true) {
    Token T = scanner.getNext();
    if (T.Kind == Token::TK_StreamEnd)
      break;
    else if (T.Kind == Token::TK_Error)
      return false;
  }
  return true;
}